

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre_test.cc
# Opt level: O2

void __thiscall
TrivialRETest_CompileFailings_Test::TestBody(TrivialRETest_CompileFailings_Test *this)

{
  pointer *this_00;
  Message *message;
  undefined1 auVar1 [8];
  char *in_R9;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l;
  string local_108 [4];
  undefined1 local_78 [8];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  examples;
  internal local_58 [8];
  AssertionResult gtest_ar_;
  basic_string_view<char,_std::char_traits<char>_> s;
  
  memcpy(local_108,&DAT_0014e4c0,0x90);
  __l._M_len = 9;
  __l._M_array = (iterator)local_108;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)local_78,__l,(allocator_type *)&gtest_ar_.message_);
  this_00 = &examples.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  for (auVar1 = local_78;
      auVar1 != (undefined1  [8])
                examples.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar1 = (undefined1  [8])((long)auVar1 + 0x10)) {
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )((string_view *)auVar1)->_M_len;
    s._M_len = (size_t)((string_view *)auVar1)->_M_str;
    local_58[0] = (internal)CompilationFails(*(string_view *)auVar1);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    if (!(bool)local_58[0]) {
      testing::Message::Message((Message *)&s._M_str);
      std::operator<<((ostream *)(s._M_str + 0x10),"s: ");
      message = testing::Message::operator<<
                          ((Message *)&s._M_str,
                           (basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (local_108,local_58,(AssertionResult *)"CompilationFails(s)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre_test.cc"
                 ,0x81,local_108[0]._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)this_00,message);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      std::__cxx11::string::~string((string *)local_108);
      if (s._M_str != (char *)0x0) {
        (**(code **)(*(long *)s._M_str + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_);
  }
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base((_Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)local_78);
  return;
}

Assistant:

TEST(TrivialRETest, CompileFailings) {
  std::vector<std::string_view> examples = {"[", "(", "{}", "((", "\\A", "\\b", "\\S", "\\s", "\\w"};
  for (auto s : examples) {
    EXPECT_TRUE(CompilationFails(s)) << "s: " << s;
  }
}